

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode Curl_proxyCONNECT(Curl_easy *data,int sockindex,char *hostname,int remote_port)

{
  curl_off_t *pcVar1;
  char **ppcVar2;
  undefined1 *puVar3;
  connectdata *pcVar4;
  long lVar5;
  ulong uVar6;
  dynbuf *s;
  curl_off_t *pcVar7;
  _Bool _Var8;
  byte bVar9;
  anon_enum_32 aVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  int iVar13;
  CHUNKcode CVar14;
  char *pcVar15;
  timediff_t tVar16;
  size_t sVar17;
  char *pcVar18;
  char *pcVar19;
  http_connect_state *phVar20;
  char *pcVar21;
  char *pcVar22;
  connectdata *conn;
  bool bVar23;
  char byte;
  connectdata *local_a8;
  dynbuf *local_a0;
  size_t fillcount;
  int local_8c;
  int *local_88;
  dynbuf *local_80;
  uint local_74;
  curl_off_t *local_70;
  curl_socket_t local_68;
  int subversion;
  char *local_60;
  anon_union_8_12_57927972_for_p local_58;
  ssize_t tookcareof;
  curl_off_t *local_48;
  long local_40;
  CURLcode extra;
  
  pcVar4 = data->conn;
  phVar20 = pcVar4->connect_state;
  conn = pcVar4;
  local_8c = sockindex;
  local_74 = remote_port;
  if (phVar20 == (http_connect_state *)0x0) {
    CVar11 = connect_init(data,false);
    if (CVar11 != CURLE_OK) {
      return CVar11;
    }
    conn = data->conn;
    phVar20 = conn->connect_state;
  }
  subversion = 0;
  if ((phVar20 != (http_connect_state *)0x0) && (phVar20->tunnel_state < TUNNEL_COMPLETE)) {
    local_40 = (long)local_8c;
    local_68 = conn->sock[local_40];
    local_58 = (data->req).p;
    puVar3 = &(conn->bits).field_0x4;
    *puVar3 = *puVar3 & 0xef;
    local_a0 = &phVar20->req;
    local_48 = &(data->info).request_size;
    local_80 = &phVar20->rcvbuf;
    local_88 = &(data->req).httpcode;
    local_70 = &phVar20->cl;
    local_a8 = conn;
    local_60 = hostname;
    do {
      aVar10 = phVar20->tunnel_state;
      do {
        if (aVar10 == TUNNEL_INIT) {
          Curl_infof(data,"Establish HTTP proxy tunnel to %s:%d",hostname,(ulong)local_74);
          (*Curl_cfree)((data->req).newurl);
          (data->req).newurl = (char *)0x0;
          Curl_dyn_init(local_a0,0x100000);
          if ((conn->host).name == hostname) {
            bVar23 = (bool)(((conn->bits).field_0x5 & 8) >> 3);
          }
          else {
            pcVar15 = strchr(hostname,0x3a);
            bVar23 = pcVar15 != (char *)0x0;
          }
          pcVar18 = "";
          pcVar15 = "";
          if (bVar23 != false) {
            pcVar15 = "[";
            pcVar18 = "]";
          }
          pcVar15 = curl_maprintf("%s%s%s:%d",pcVar15,hostname,pcVar18,(ulong)local_74);
          if (pcVar15 == (char *)0x0) {
LAB_004ef181:
            CVar11 = CURLE_OUT_OF_MEMORY;
            goto LAB_004ef00b;
          }
          pcVar18 = Curl_checkProxyheaders(data,conn,"Host",4);
          if (pcVar18 == (char *)0x0) {
            pcVar18 = curl_maprintf("Host: %s\r\n",pcVar15);
            if (pcVar18 == (char *)0x0) {
              (*Curl_cfree)(pcVar15);
              goto LAB_004ef181;
            }
          }
          else {
            pcVar18 = (char *)0x0;
          }
          CVar11 = Curl_http_output_auth(data,local_a8,"CONNECT",HTTPREQ_GET,pcVar15,true);
          if (CVar11 == CURLE_OK) {
            pcVar19 = "1.1";
            if ((local_a8->http_proxy).proxytype == '\x01') {
              pcVar19 = "1.0";
            }
            pcVar21 = pcVar18;
            if (pcVar18 == (char *)0x0) {
              pcVar21 = "";
            }
            pcVar22 = (data->state).aptr.proxyuserpwd;
            if (pcVar22 == (char *)0x0) {
              pcVar22 = "";
            }
            CVar12 = Curl_dyn_addf(local_a0,"CONNECT %s HTTP/%s\r\n%s%s",pcVar15,pcVar19,pcVar21,
                                   pcVar22);
            if ((((CVar12 == CURLE_OK) &&
                 ((((pcVar19 = Curl_checkProxyheaders(data,local_a8,"User-Agent",10),
                    pcVar19 != (char *)0x0 || ((data->set).str[0x24] == (char *)0x0)) ||
                   (CVar12 = Curl_dyn_addf(local_a0,"User-Agent: %s\r\n"), CVar12 == CURLE_OK)) &&
                  ((pcVar19 = Curl_checkProxyheaders(data,local_a8,"Proxy-Connection",0x10),
                   pcVar19 != (char *)0x0 ||
                   (CVar12 = Curl_dyn_addn(local_a0,"Proxy-Connection: Keep-Alive\r\n",0x1e),
                   CVar12 == CURLE_OK)))))) &&
                (CVar12 = Curl_add_custom_headers(data,true,local_a0), CVar12 == CURLE_OK)) &&
               (CVar12 = Curl_dyn_addn(local_a0,"\r\n",2), CVar12 == CURLE_OK)) {
              CVar11 = CURLE_OK;
              CVar12 = Curl_buffer_send(local_a0,data,local_48,0,local_8c);
              phVar20->headerlines = 0;
              if (CVar12 == CURLE_OK) goto LAB_004ee7d7;
            }
            Curl_failf(data,"Failed sending CONNECT to proxy");
            CVar11 = CVar12;
          }
LAB_004ee7d7:
          (*Curl_cfree)(pcVar18);
          (*Curl_cfree)(pcVar15);
          if (CVar11 != CURLE_OK) goto LAB_004ef00b;
          phVar20->tunnel_state = TUNNEL_CONNECT;
          conn = local_a8;
        }
        tVar16 = Curl_timeleft(data,(curltime *)0x0,true);
        if (tVar16 < 1) {
          Curl_failf(data,"Proxy CONNECT aborted due to timeout");
          CVar11 = CURLE_OPERATION_TIMEDOUT;
          goto LAB_004ef00b;
        }
        _Var8 = Curl_conn_data_pending(conn,local_8c);
        if ((local_58.http)->sending == HTTPSEND_NADA && !_Var8) goto LAB_004eeff3;
        if ((local_58.http)->sending == HTTPSEND_REQUEST) {
          sVar17 = phVar20->nsend;
          if (phVar20->nsend == 0) {
            (data->req).upload_fromhere = (data->state).ulbuf;
            CVar11 = Curl_fillreadbuffer(data,(ulong)(data->set).upload_buffer_size,&fillcount);
            if (CVar11 != CURLE_OK) goto LAB_004ef00b;
            phVar20->nsend = fillcount;
            sVar17 = fillcount;
            if (fillcount == 0) {
              (local_58.http)->sending = HTTPSEND_NADA;
              goto LAB_004ee8a0;
            }
          }
          CVar11 = Curl_write(data,conn->writesockfd,(data->req).upload_fromhere,sVar17,
                              (ssize_t *)&fillcount);
          if (CVar11 == CURLE_OK) {
            Curl_debug(data,CURLINFO_HEADER_OUT,(data->req).upload_fromhere,fillcount);
          }
          phVar20->nsend = phVar20->nsend - fillcount;
          ppcVar2 = &(data->req).upload_fromhere;
          *ppcVar2 = *ppcVar2 + fillcount;
LAB_004eefee:
          if (CVar11 != CURLE_OK) goto LAB_004ef00b;
          goto LAB_004eeff3;
        }
LAB_004ee8a0:
        bVar23 = false;
        CVar11 = CURLE_OK;
        if (phVar20->keepon == KEEPON_DONE) goto LAB_004eee41;
        CVar12 = Curl_read(data,local_68,&byte,1,(ssize_t *)&fillcount);
        if (CVar12 == CURLE_AGAIN) goto LAB_004eefee;
        iVar13 = Curl_pgrsUpdate(data);
        if (iVar13 != 0) {
          CVar11 = CURLE_ABORTED_BY_CALLBACK;
          goto LAB_004eefee;
        }
        if (CVar12 != CURLE_OK) {
          phVar20->keepon = KEEPON_DONE;
          goto LAB_004eee3e;
        }
        if ((long)fillcount < 1) {
          if ((((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) ||
             ((data->state).aptr.proxyuserpwd == (char *)0x0)) {
            Curl_failf(data,"Proxy CONNECT aborted");
            bVar23 = true;
          }
          else {
            puVar3 = &(conn->bits).field_0x4;
            *puVar3 = *puVar3 | 0x10;
            bVar23 = false;
            Curl_infof(data,"Proxy CONNECT connection closed");
          }
          phVar20->keepon = KEEPON_DONE;
          goto LAB_004eee41;
        }
        if (phVar20->keepon != KEEPON_IGNORE) {
          CVar11 = Curl_dyn_addn(local_80,&byte,1);
          s = local_80;
          if (CVar11 != CURLE_OK) {
            Curl_failf(data,"CONNECT response too large");
            CVar11 = CURLE_RECV_ERROR;
            goto LAB_004eefee;
          }
          if (byte != '\n') goto LAB_004ee8a0;
          phVar20->headerlines = phVar20->headerlines + 1;
          pcVar15 = Curl_dyn_ptr(local_80);
          sVar17 = Curl_dyn_len(s);
          Curl_debug(data,CURLINFO_HEADER_IN,pcVar15,sVar17);
          uVar6 = *(ulong *)&(data->set).field_0x8e2;
          if (((uVar6 >> 0x2b & 1) == 0) &&
             (CVar11 = Curl_client_write(data,((uint)(uVar6 >> 0x16) & 1) + 10 +
                                              (uint)(phVar20->headerlines == 1) * 4,pcVar15,sVar17),
             CVar11 != CURLE_OK)) goto LAB_004eefee;
          pcVar7 = local_70;
          conn = local_a8;
          pcVar1 = &(data->info).header_size;
          *pcVar1 = *pcVar1 + sVar17;
          if ((*pcVar15 != '\r') && (*pcVar15 != '\n')) {
            iVar13 = curl_strnequal(pcVar15,"WWW-Authenticate:",0x11);
            if ((iVar13 == 0) || (*local_88 != 0x191)) {
              iVar13 = curl_strnequal(pcVar15,"Proxy-authenticate:",0x13);
              pcVar1 = local_70;
              if ((iVar13 != 0) && (_Var8 = true, *local_88 == 0x197)) goto LAB_004eead7;
              iVar13 = curl_strnequal(pcVar15,"Content-Length:",0xf);
              conn = local_a8;
              if (iVar13 == 0) {
                _Var8 = Curl_compareheader(pcVar15,"Connection:",0xb,"close",5);
                if (_Var8) {
LAB_004eebab:
                  phVar20->field_0x354 = phVar20->field_0x354 | 2;
                }
                else {
                  iVar13 = curl_strnequal(pcVar15,"Transfer-Encoding:",0x12);
                  if (iVar13 == 0) {
                    _Var8 = Curl_compareheader(pcVar15,"Proxy-Connection:",0x11,"close",5);
                    if (_Var8) goto LAB_004eebab;
                    iVar13 = __isoc99_sscanf(pcVar15,"HTTP/1.%d %d",&subversion,local_88);
                    if (iVar13 == 2) {
                      (data->info).httpproxycode = (data->req).httpcode;
                    }
                  }
                  else {
                    if (*local_88 - 200U < 100) {
                      pcVar15 = "Ignoring Transfer-Encoding in CONNECT %03d response";
                      goto LAB_004eeb53;
                    }
                    _Var8 = Curl_compareheader(pcVar15,"Transfer-Encoding:",0x12,"chunked",7);
                    if (_Var8) {
                      Curl_infof(data,"CONNECT responded chunked");
                      phVar20->field_0x354 = phVar20->field_0x354 | 1;
                      Curl_httpchunk_init(data);
                    }
                  }
                }
              }
              else if (*local_88 - 200U < 100) {
                pcVar15 = "Ignoring Content-Length in CONNECT %03d response";
LAB_004eeb53:
                Curl_infof(data,pcVar15);
              }
              else {
                curlx_strtoofft(pcVar15 + 0xf,(char **)0x0,10,pcVar1);
              }
            }
            else {
              _Var8 = false;
LAB_004eead7:
              pcVar15 = Curl_copy_header_value(pcVar15);
              if (pcVar15 == (char *)0x0) {
                CVar11 = CURLE_OUT_OF_MEMORY;
                goto LAB_004eefee;
              }
              CVar11 = Curl_http_input_auth(data,_Var8,pcVar15);
              (*Curl_cfree)(pcVar15);
              conn = local_a8;
              if (CVar11 != CURLE_OK) goto LAB_004eefee;
            }
            Curl_dyn_reset(local_80);
            goto LAB_004ee8a0;
          }
          if ((*local_88 == 0x197) && (((data->state).field_0x6d0 & 0x20) == 0)) {
            phVar20->keepon = KEEPON_IGNORE;
            if (phVar20->cl == 0) {
              if ((phVar20->field_0x354 & 1) == 0) goto LAB_004eeb65;
              Curl_infof(data,"Ignore chunked response-body");
              puVar3 = &(data->req).field_0xd9;
              *puVar3 = *puVar3 | 8;
              pcVar18 = pcVar15 + 1;
              if (pcVar15[1] != '\n') {
                pcVar18 = pcVar15;
              }
              CVar14 = Curl_httpchunk_read(data,pcVar18 + 1,1,(ssize_t *)&fillcount,
                                           (CURLcode *)&tookcareof);
              if (CVar14 == CHUNKE_STOP) {
                Curl_infof(data,"chunk reading DONE");
                phVar20->keepon = KEEPON_DONE;
                phVar20->tunnel_state = TUNNEL_COMPLETE;
              }
            }
            else {
              Curl_infof(data,"Ignore %ld bytes of response-body");
            }
            if (phVar20->keepon != KEEPON_DONE) goto LAB_004ee8a0;
          }
          else {
LAB_004eeb65:
            phVar20->keepon = KEEPON_DONE;
          }
          if (*pcVar7 == 0) goto LAB_004eeb77;
          goto LAB_004ee8a0;
        }
        lVar5 = *local_70;
        if (lVar5 == 0) {
          tookcareof = 0;
          CVar14 = Curl_httpchunk_read(data,&byte,1,&tookcareof,&extra);
          if (CVar14 == CHUNKE_STOP) {
            Curl_infof(data,"chunk reading DONE");
            phVar20->keepon = KEEPON_DONE;
LAB_004eeb77:
            phVar20->tunnel_state = TUNNEL_COMPLETE;
          }
          goto LAB_004ee8a0;
        }
        *local_70 = lVar5 + -1;
        if (1 < lVar5) goto LAB_004ee8a0;
        phVar20->keepon = KEEPON_DONE;
        phVar20->tunnel_state = TUNNEL_COMPLETE;
LAB_004eee3e:
        bVar23 = false;
LAB_004eee41:
        iVar13 = Curl_pgrsUpdate(data);
        if ((bVar23) || (iVar13 != 0)) {
          CVar11 = CURLE_RECV_ERROR;
          if (iVar13 != 0) {
            CVar11 = CURLE_ABORTED_BY_CALLBACK;
          }
          goto LAB_004ef00b;
        }
        if ((data->info).httpproxycode - 200U < 100) {
          bVar9 = phVar20->field_0x354;
        }
        else {
          CVar11 = Curl_http_auth_act(data);
          if (CVar11 != CURLE_OK) goto LAB_004ef00b;
          bVar9 = phVar20->field_0x354;
          if (((conn->bits).field_0x4 & 0x40) != 0) {
            bVar9 = bVar9 | 2;
            phVar20->field_0x354 = bVar9;
          }
        }
        lVar5 = local_40;
        hostname = local_60;
        pcVar15 = (data->req).newurl;
        if ((bVar9 & 2) != 0) {
          if (pcVar15 != (char *)0x0) {
            Curl_closesocket(data,conn,conn->sock[local_40]);
            conn->sock[lVar5] = -1;
          }
          goto LAB_004ef05d;
        }
        if (pcVar15 == (char *)0x0) goto LAB_004ef05d;
        aVar10 = phVar20->tunnel_state;
      } while (aVar10 != TUNNEL_COMPLETE);
      connect_init(data,true);
    } while ((data->req).newurl != (char *)0x0);
LAB_004ef05d:
    if ((data->info).httpproxycode - 200U < 100) {
      phVar20->tunnel_state = TUNNEL_COMPLETE;
      (*Curl_cfree)((data->state).aptr.proxyuserpwd);
      (data->state).aptr.proxyuserpwd = (char *)0x0;
      (data->state).authproxy.field_0x18 = ((data->state).authproxy.field_0x18 & 0xfc) + 1;
      Curl_infof(data,"Proxy replied %d to CONNECT request",(ulong)(uint)(data->info).httpproxycode)
      ;
      puVar3 = &(data->req).field_0xd9;
      *puVar3 = *puVar3 & 0xf7;
      puVar3 = &(conn->bits).field_0x6;
      *puVar3 = *puVar3 & 0xfd;
      Curl_dyn_free(local_80);
    }
    else {
      pcVar15 = (data->req).newurl;
      if (pcVar15 == (char *)0x0 || (phVar20->field_0x354 & 2) == 0) {
        (*Curl_cfree)(pcVar15);
        (data->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
      }
      else {
        puVar3 = &(conn->bits).field_0x4;
        *puVar3 = *puVar3 | 0x10;
        Curl_infof(data,"Connect me again please");
        Curl_connect_done(data);
      }
      phVar20->tunnel_state = TUNNEL_INIT;
      if (((conn->bits).field_0x4 & 0x10) == 0) {
        Curl_dyn_free(local_80);
        Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(data->req).httpcode);
        CVar11 = CURLE_RECV_ERROR;
        goto LAB_004ef00b;
      }
    }
  }
LAB_004eeff3:
  CVar11 = CURLE_OK;
  if ((pcVar4->connect_state != (http_connect_state *)0x0) &&
     (pcVar4->connect_state->tunnel_state < TUNNEL_COMPLETE)) {
    return CURLE_OK;
  }
LAB_004ef00b:
  Curl_connect_done(data);
  return CVar11;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct Curl_easy *data,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  if(!conn->connect_state) {
    result = connect_init(data, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(data, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    Curl_connect_done(data);

  return result;
}